

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

int regex_is_match(regex_handle *re,char *subject)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  
  puVar1 = (undefined8 *)re->priv;
  sVar4 = strlen(subject);
  lVar5 = pcre2_match_data_create_from_pattern_8(*puVar1,0);
  if (lVar5 == 0) {
    iVar3 = -0x16;
  }
  else {
    iVar2 = pcre2_match_8(*puVar1,subject,sVar4,0,0,lVar5,0);
    pcre2_match_data_free_8(lVar5);
    if (iVar2 < 0) {
      iVar3 = -0x16;
      if (iVar2 == -1) {
        iVar3 = 0;
      }
    }
    else {
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int regex_is_match(const struct regex_handle *re, const char *subject)
{
	const struct regex_priv *priv = (const struct regex_priv *)re->priv;
	PCRE2_SPTR sub = (PCRE2_SPTR)subject;
	size_t sub_len = strlen(subject);
	pcre2_match_data *match_data = pcre2_match_data_create_from_pattern(priv->re, NULL);
	int ret;

	if (match_data == NULL)
		return -EINVAL;

	ret = pcre2_match(priv->re, sub, sub_len, 0, 0, match_data, NULL);

	pcre2_match_data_free(match_data);

	if (ret < 0) {
		if (ret == PCRE2_ERROR_NOMATCH)
			return 0;
		else
			return -EINVAL;
	} else {
		return 1;
	}
}